

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CaseStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CaseStatement,slang::ast::CaseStatementCondition&,slang::ast::UniquePriorityCheck&,slang::ast::Expression_const&,std::span<slang::ast::CaseStatement::ItemGroup,18446744073709551615ul>,slang::ast::Statement_const*&,slang::SourceRange>
          (BumpAllocator *this,CaseStatementCondition *args,UniquePriorityCheck *args_1,
          Expression *args_2,
          span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *args_3,
          Statement **args_4,SourceRange *args_5)

{
  span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> items;
  SourceRange sourceRange;
  CaseStatement *pCVar1;
  CaseStatement *in_RCX;
  CaseStatementCondition *in_RDX;
  UniquePriorityCheck *in_RSI;
  SourceLocation in_R9;
  size_t *in_stack_00000008;
  span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *in_stack_ffffffffffffff88;
  Expression *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  UniquePriorityCheck check;
  undefined4 in_stack_ffffffffffffff9c;
  CaseStatementCondition condition;
  Statement *in_stack_ffffffffffffffc0;
  SourceLocation in_stack_ffffffffffffffc8;
  
  pCVar1 = (CaseStatement *)
           allocate((BumpAllocator *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (size_t)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
  check = *in_RSI;
  condition = *in_RDX;
  std::span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>::
  span<slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL>
            ((span<const_slang::ast::CaseStatement::ItemGroup,_18446744073709551615UL> *)
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  items._M_extent._M_extent_value = *in_stack_00000008;
  items._M_ptr = (pointer)pCVar1;
  sourceRange.endLoc = in_R9;
  sourceRange.startLoc = in_stack_ffffffffffffffc8;
  slang::ast::CaseStatement::CaseStatement
            (in_RCX,condition,check,in_stack_ffffffffffffff90,items,in_stack_ffffffffffffffc0,
             sourceRange);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }